

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFillBufferTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_0::UpdateBufferTestInstance::iterate
          (TestStatus *__return_storage_ptr__,UpdateBufferTestInstance *this)

{
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *this_00;
  Move<vk::Handle<(vk::HandleType)6>_> *pMVar1;
  Allocation *pAVar2;
  VkResult VVar3;
  TextureLevel *pTVar4;
  DeviceInterface *vkd;
  VkDevice device;
  VkQueue pVVar5;
  int height;
  int width;
  int depth;
  int width_00;
  ulong uVar6;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultLevel;
  PixelBufferAccess local_1a0;
  TextureFormat local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  deUint64 local_158;
  undefined8 local_150;
  VkDeviceSize local_148;
  TextureFormat local_140;
  VkSubmitInfo submitInfo;
  ConstPixelBufferAccess local_f0;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined1 local_80 [16];
  deUint32 local_70;
  int local_64;
  VkPipelineStageFlags *local_60;
  
  uVar6 = (this->super_FillBufferTestInstance).m_params.dstSize;
  pTVar4 = (TextureLevel *)operator_new(0x28);
  local_178 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UINT);
  uVar6 = uVar6 >> 2;
  width_00 = (int)uVar6;
  height = 1;
  depth = 1;
  tcu::TextureLevel::TextureLevel(pTVar4,&local_178,width_00,1,1);
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  if ((this->super_FillBufferTestInstance).m_destinationTextureLevel.
      super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr !=
      pTVar4) {
    this_00 = &(this->super_FillBufferTestInstance).m_destinationTextureLevel;
    de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
              (&this_00->super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
              );
    (this_00->super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>).m_data.
    ptr = pTVar4;
  }
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&submitInfo);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&stack0xffffffffffffffa8,
             (this->super_FillBufferTestInstance).m_destinationTextureLevel.
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr)
  ;
  FillBufferTestInstance::generateBuffer
            ((FillBufferTestInstance *)&stack0xffffffffffffffa8,
             (PixelBufferAccess *)(uVar6 & 0xffffffff),width,height,depth);
  (*(this->super_FillBufferTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&submitInfo,
             (this->super_FillBufferTestInstance).m_destinationTextureLevel.
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr)
  ;
  local_80._0_8_ = submitInfo._0_8_;
  local_80._8_8_ = submitInfo.pNext;
  local_70 = submitInfo.waitSemaphoreCount;
  local_64 = submitInfo.pWaitSemaphores._4_4_;
  local_60 = submitInfo.pWaitDstStageMask;
  FillBufferTestInstance::uploadBuffer
            (&this->super_FillBufferTestInstance,(ConstPixelBufferAccess *)local_80,
             (this->super_FillBufferTestInstance).m_destinationBufferAlloc.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr);
  vkd = Context::getDeviceInterface
                  ((this->super_FillBufferTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_FillBufferTestInstance).super_TestInstance.m_context);
  pVVar5 = Context::getUniversalQueue
                     ((this->super_FillBufferTestInstance).super_TestInstance.m_context);
  local_178.order = 0x2c;
  local_170 = 0;
  local_168 = 0x200000001000;
  uStack_160 = 0xffffffffffffffff;
  local_158 = (this->super_FillBufferTestInstance).m_destination.
              super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_150 = 0;
  local_148 = (this->super_FillBufferTestInstance).m_params.dstOffset;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext._0_4_ = 0;
  cmdBufferBeginInfo.pNext._4_4_ = 0;
  VVar3 = (*vkd->_vptr_DeviceInterface[0x49])
                    (vkd,(this->super_FillBufferTestInstance).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar3,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x13c);
  (*vkd->_vptr_DeviceInterface[100])
            (vkd,(this->super_FillBufferTestInstance).m_cmdBuffer.
                 super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->super_FillBufferTestInstance).m_destination.
             super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (this->super_FillBufferTestInstance).m_params.dstOffset,
             (this->super_FillBufferTestInstance).m_params.size,
             (this->super_FillBufferTestInstance).m_params.testData);
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,(this->super_FillBufferTestInstance).m_cmdBuffer.
                 super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,1,0,0,0,1,&local_178,0,
             0);
  VVar3 = (*vkd->_vptr_DeviceInterface[0x4a])
                    (vkd,(this->super_FillBufferTestInstance).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar3,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x13f);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pMVar1 = &(this->super_FillBufferTestInstance).m_fence;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&(this->super_FillBufferTestInstance).m_cmdBuffer;
  VVar3 = (*vkd->_vptr_DeviceInterface[0x14])(vkd,device,1,pMVar1);
  ::vk::checkResult(VVar3,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x14e);
  VVar3 = (*vkd->_vptr_DeviceInterface[2])
                    (vkd,pVVar5,1,&submitInfo,
                     (this->super_FillBufferTestInstance).m_fence.
                     super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal);
  ::vk::checkResult(VVar3,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x14f);
  VVar3 = (*vkd->_vptr_DeviceInterface[0x16])(vkd,device,1,pMVar1,1,0xffffffffffffffff);
  ::vk::checkResult(VVar3,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFillBufferTests.cpp"
                    ,0x150);
  pTVar4 = (TextureLevel *)operator_new(0x28);
  tcu::TextureLevel::getAccess
            (&local_1a0,
             (this->super_FillBufferTestInstance).m_destinationTextureLevel.
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr)
  ;
  tcu::TextureLevel::TextureLevel(pTVar4,(TextureFormat *)&local_1a0,width_00,1,1);
  pAVar2 = (this->super_FillBufferTestInstance).m_destinationBufferAlloc.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  resultLevel.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr
       = pTVar4;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,
             (this->super_FillBufferTestInstance).m_params.dstOffset);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_1a0,pTVar4);
  local_140 = (resultLevel.
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
              ptr)->m_format;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_f0,&local_140,
             &(resultLevel.
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
              ptr)->m_size,
             ((this->super_FillBufferTestInstance).m_destinationBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  tcu::copy((EVP_PKEY_CTX *)&local_1a0,(EVP_PKEY_CTX *)&local_f0);
  tcu::TextureLevel::getAccess
            (&local_1a0,
             resultLevel.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
             .m_data.ptr);
  (*(this->super_FillBufferTestInstance).super_TestInstance._vptr_TestInstance[4])
            (__return_storage_ptr__,this);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&resultLevel.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus UpdateBufferTestInstance::iterate (void)
{
	const int	dstLevelWidth		= (int)(m_params.dstSize / 4);
	m_destinationTextureLevel		= de::MovePtr<tcu::TextureLevel>(new tcu::TextureLevel(mapVkFormat(VK_FORMAT_R8G8B8A8_UINT), dstLevelWidth, 1));

	generateBuffer(m_destinationTextureLevel->getAccess(), dstLevelWidth, 1, 1);

	generateExpectedResult();

	uploadBuffer(m_destinationTextureLevel->getAccess(), *m_destinationBufferAlloc);

	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();

	const VkBufferMemoryBarrier		dstBufferBarrier	=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*m_destination,								// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		m_params.dstOffset							// VkDeviceSize		size;
	};

	const VkCommandBufferBeginInfo	cmdBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdUpdateBuffer(*m_cmdBuffer, *m_destination, m_params.dstOffset, m_params.size, m_params.testData);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &dstBufferBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	const VkSubmitInfo				submitInfo			=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	// Read buffer data
	de::MovePtr<tcu::TextureLevel>	resultLevel	(new tcu::TextureLevel(m_destinationTextureLevel->getAccess().getFormat(), dstLevelWidth, 1));
	invalidateMappedMemoryRange(vk, vkDevice, m_destinationBufferAlloc->getMemory(), m_destinationBufferAlloc->getOffset(), m_params.dstOffset);
	tcu::copy(*resultLevel, tcu::ConstPixelBufferAccess(resultLevel->getFormat(), resultLevel->getSize(), m_destinationBufferAlloc->getHostPtr()));

	return checkTestResult(resultLevel->getAccess());
}